

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O1

void __thiscall FIX::ThreadedSocketAcceptor::onStop(ThreadedSocketAcceptor *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  time_t tVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  time_t start;
  time_t now;
  SocketToThread threads;
  time_t local_68;
  time_t local_60;
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  local_58;
  
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Mutex::lock(&this->m_mutex);
  local_68 = 0;
  local_60 = 0;
  time(&local_68);
  do {
    bVar3 = Acceptor::isLoggedOn(&this->super_Acceptor);
    if (!bVar3) break;
    tVar4 = time(&local_60);
  } while (tVar4 + -5 < local_68);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::operator=(&local_58,&(this->m_threads)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::clear(&(this->m_threads)._M_t);
  iVar2 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar2 + -1;
  p_Var5 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar2 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    p_Var5 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  for (; p_Var6 = local_58._M_impl.super__Rb_tree_header._M_header._M_left,
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    socket_close(p_Var5[1]._M_color);
  }
  for (; (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    thread_join((thread_id)p_Var6[1]._M_parent);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void ThreadedSocketAcceptor::onStop()
{ 
  SocketToThread threads;
  SocketToThread::iterator i;

  {
    Locker l(m_mutex);

    time_t start = 0;
    time_t now = 0;

    ::time( &start );
    while ( isLoggedOn() )
    {
      if( ::time(&now) -5 >= start )
        break;
    }

    threads = m_threads;
    m_threads.clear();
  }

  for ( i = threads.begin(); i != threads.end(); ++i )
    socket_close( i->first );
  for ( i = threads.begin(); i != threads.end(); ++i )
    thread_join( i->second );
}